

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O0

void __thiscall mp::pre::Many2ManyLink::AddEntry(Many2ManyLink *this,LinkEntry be)

{
  NodeRange nr;
  NodeRange nr_00;
  bool bVar1;
  NodeIndexRange in_RDI;
  undefined1 in_stack_0000002f;
  value_type *__x;
  ValueNode *in_stack_ffffffffffffffd8;
  int i;
  NodeIndexRange in_stack_ffffffffffffffe0;
  ValueNode *in_stack_ffffffffffffffe8;
  NodeIndexRange in_stack_fffffffffffffff0;
  NodeIndexRange NVar2;
  
  __x = (value_type *)&stack0x00000008;
  NVar2 = in_RDI;
  bVar1 = std::
          deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
          ::empty((deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                   *)0x198ba5);
  if (!bVar1) {
    std::
    deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
    ::back((deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
            *)in_stack_ffffffffffffffe0);
    bVar1 = NodeRange::operator==
                      ((NodeRange *)in_stack_ffffffffffffffe0,(NodeRange *)in_stack_ffffffffffffffd8
                      );
    if (bVar1) {
      std::
      deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
      ::back((deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
              *)in_stack_ffffffffffffffe0);
      in_stack_ffffffffffffffe8 = (__x->second).pvn_;
      in_stack_fffffffffffffff0 = (__x->second).ir_;
      nr.ir_ = NVar2;
      nr.pvn_ = (ValueNode *)in_stack_fffffffffffffff0;
      bVar1 = NodeRange::TryExtendBy((NodeRange *)in_stack_ffffffffffffffe8,nr);
      if (bVar1) {
        return;
      }
    }
    std::
    deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
    ::back((deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
            *)in_stack_ffffffffffffffe0);
    bVar1 = NodeRange::operator==
                      ((NodeRange *)in_stack_ffffffffffffffe0,(NodeRange *)in_stack_ffffffffffffffd8
                      );
    if (bVar1) {
      std::
      deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
      ::back((deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
              *)in_stack_ffffffffffffffe0);
      in_stack_ffffffffffffffd8 = (__x->first).pvn_;
      in_stack_ffffffffffffffe0 = (__x->first).ir_;
      nr_00.ir_ = NVar2;
      nr_00.pvn_ = (ValueNode *)in_stack_fffffffffffffff0;
      bVar1 = NodeRange::TryExtendBy((NodeRange *)in_stack_ffffffffffffffe8,nr_00);
      if (bVar1) {
        return;
      }
    }
  }
  i = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  std::
  deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
  ::push_back((deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
               *)in_RDI,__x);
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)this,(bool)in_stack_0000002f);
  std::
  deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
  ::size((deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
          *)0x198ca0);
  BasicLink::RegisterLinkIndex((BasicLink *)in_stack_ffffffffffffffe0,i);
  return;
}

Assistant:

void AddEntry(LinkEntry be) {
    if (entries_.empty() ||
        !(
          (entries_.back().first==be.first   // same sources
           && entries_.back().second.TryExtendBy(be.second))
          ||
          (entries_.back().second==be.second // same targets
           && entries_.back().first.TryExtendBy(be.first))
          )) {
      entries_.push_back(be);             // Add new entry
      if_consider_for_last_link_.push_back(false);
      RegisterLinkIndex(entries_.size()-1);
    }
  }